

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

int Vec_StrGetI_ne(Vec_Str_t *vOut,int *pPos)

{
  int i_00;
  byte bVar1;
  undefined4 local_20;
  undefined4 local_1c;
  int Val;
  int i;
  int *pPos_local;
  Vec_Str_t *vOut_local;
  
  local_20 = 0;
  for (local_1c = 3; -1 < local_1c; local_1c = local_1c + -1) {
    i_00 = *pPos;
    *pPos = i_00 + 1;
    bVar1 = Vec_StrEntry(vOut,i_00);
    local_20 = (uint)bVar1 << ((byte)(local_1c << 3) & 0x1f) | local_20;
  }
  return local_20;
}

Assistant:

static inline int Vec_StrGetI_ne( Vec_Str_t * vOut, int * pPos )
{
    int i;
    int Val = 0;
//    for ( i = 0; i < 4; i++ )
    for ( i = 3; i >= 0; i-- )
        Val |= ((int)(unsigned char)Vec_StrEntry(vOut, (*pPos)++) << (8*i));
    return Val;
}